

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

void __thiscall Vector<long_double>::destroy(Vector<long_double> *this)

{
  if (this->ptr_to_data != (longdouble *)0x0) {
    operator_delete__(this->ptr_to_data);
  }
  this->num_elts = 0;
  this->ptr_to_data = (longdouble *)0x0;
  return;
}

Assistant:

inline void Vector< T >::destroy() 
{
#ifdef DEBUG
    fprintf(stderr,"Vector<>::destroy()         |                   | adr =  %x \n", ptr_to_data);
#endif
    if (ptr_to_data != 0) 
	delete [] ptr_to_data; 
    else {
    }	

    num_elts = 0; ptr_to_data = (T*)0;
}